

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alp_utils.hpp
# Opt level: O0

AlpSamplingParameters duckdb::alp::AlpUtils::GetSamplingParameters(idx_t current_vector_n_values)

{
  AlpSamplingParameters AVar1;
  uint n_lookup_values_00;
  uint uVar2;
  uint n_sampled_values_00;
  unsigned_long in_RDI;
  uint32_t n_sampled_values;
  uint32_t n_sampled_increments;
  uint n_lookup_values;
  AlpSamplingParameters sampling_params;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  AlpSamplingParameters local_c;
  
  MinValue<unsigned_long>(in_RDI,0x400);
  n_lookup_values_00 = NumericCast<unsigned_int,unsigned_long,void>(0x9f08c0);
  ceil((double)n_lookup_values_00 * 0.03125);
  uVar2 = ExactNumericCast<unsigned_int>
                    ((double)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
  uVar2 = MaxValue<unsigned_int>(1,uVar2);
  ceil((double)n_lookup_values_00 / (double)uVar2);
  n_sampled_values_00 =
       ExactNumericCast<unsigned_int>
                 ((double)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
  AlpSamplingParameters::AlpSamplingParameters
            (&local_c,n_lookup_values_00,uVar2,n_sampled_values_00);
  AVar1.n_sampled_values = local_c.n_sampled_values;
  AVar1.n_lookup_values = local_c.n_lookup_values;
  AVar1.n_sampled_increments = local_c.n_sampled_increments;
  return AVar1;
}

Assistant:

static AlpSamplingParameters GetSamplingParameters(idx_t current_vector_n_values) {

		auto n_lookup_values =
		    NumericCast<uint32_t>(MinValue(current_vector_n_values, (idx_t)AlpConstants::ALP_VECTOR_SIZE));
		//! We sample equidistant values within a vector; to do this we jump a fixed number of values
		uint32_t n_sampled_increments = MaxValue<uint32_t>(
		    1, ExactNumericCast<uint32_t>(std::ceil((double)n_lookup_values / AlpConstants::SAMPLES_PER_VECTOR)));
		uint32_t n_sampled_values =
		    ExactNumericCast<uint32_t>(std::ceil((double)n_lookup_values / n_sampled_increments));
		D_ASSERT(n_sampled_values < AlpConstants::ALP_VECTOR_SIZE);

		AlpSamplingParameters sampling_params = {n_lookup_values, n_sampled_increments, n_sampled_values};
		return sampling_params;
	}